

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::SetUpFirstNode(QL_Manager *this,QL_Node **topNode)

{
  char **ppcVar1;
  RelCatEntry *pRVar2;
  Condition *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Condition condition;
  bool bVar6;
  bool bVar7;
  Condition *pCVar8;
  QL_NodeRel *this_00;
  int *attrs;
  mapped_type *pmVar9;
  QL_NodeSel *this_01;
  long lVar10;
  QL_NodeSel *selNode;
  uint local_94;
  byte local_8d;
  int index;
  int iStack_88;
  bool added;
  int i_2;
  int numConds;
  int i_1;
  int start;
  string relString;
  int i;
  int *attrList;
  QL_NodeRel *relNode;
  int relIndex;
  bool useIndex;
  bool useSelNode;
  RC rc;
  QL_Node **topNode_local;
  QL_Manager *this_local;
  
  bVar7 = false;
  bVar6 = false;
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries);
  *topNode = (QL_Node *)this_00;
  attrs = (int *)malloc((long)this->relEntries->attrCount << 2);
  memset(attrs,0,8);
  for (relString.field_2._12_4_ = 0; (int)relString.field_2._12_4_ < this->relEntries->attrCount;
      relString.field_2._12_4_ = relString.field_2._12_4_ + 1) {
    attrs[(int)relString.field_2._12_4_] = 0;
  }
  pRVar2 = this->relEntries;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&start,pRVar2->relName,(allocator *)((long)&i_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->relToAttrIndex,(key_type *)&start);
  numConds = *pmVar9;
  for (i_2 = 0; i_2 < this->relEntries->attrCount; i_2 = i_2 + 1) {
    attrs[i_2] = numConds + i_2;
  }
  QL_NodeRel::SetUpNode(this_00,attrs,this->relEntries->attrCount);
  free(attrs);
  CountNumConditions(this,0,&stack0xffffffffffffff78);
  for (index = 0; index < this->nConds; index = index + 1) {
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->conditionToRel,&index);
    if (*pmVar9 == 0) {
      local_8d = 0;
      if ((((this->condptr[index].op == EQ_OP) && (this->condptr[index].bRhsIsAttr == 0)) &&
          (!bVar6)) && ((this->isUpdate & 1U) == 0)) {
        local_94 = 0;
        this_local._4_4_ = GetAttrCatEntryPos(this,this->condptr[index].lhsAttr,(int *)&local_94);
        if (this_local._4_4_ != 0) goto LAB_00118c76;
        if (this->attrEntries[(int)local_94].indexNo != -1) {
          this_local._4_4_ =
               (*(this_00->super_QL_Node)._vptr_QL_Node[8])
                         (this_00,(ulong)local_94,
                          (ulong)(uint)this->attrEntries[(int)local_94].indexNo,
                          this->condptr[index].rhsValue.data);
          if (this_local._4_4_ != 0) goto LAB_00118c76;
          local_8d = 1;
          bVar6 = true;
        }
      }
      if (((local_8d & 1) == 0) && (!bVar7)) {
        this_01 = (QL_NodeSel *)operator_new(0x58);
        QL_NodeSel::QL_NodeSel(this_01,this,(QL_Node *)this_00);
        this_local._4_4_ = QL_NodeSel::SetUpNode(this_01,iStack_88);
        if (this_local._4_4_ != 0) goto LAB_00118c76;
        *topNode = (QL_Node *)this_01;
        bVar7 = true;
      }
      if ((local_8d & 1) == 0) {
        pCVar3 = this->condptr;
        lVar10 = (long)index;
        pCVar8 = pCVar3 + lVar10;
        uVar4 = pCVar8->op;
        uVar5 = pCVar8->bRhsIsAttr;
        condition.bRhsIsAttr = uVar5;
        condition.op = uVar4;
        ppcVar1 = &pCVar3[lVar10].rhsAttr.attrName;
        condition.lhsAttr = pCVar3[lVar10].lhsAttr;
        condition.rhsAttr.relName = ((RelAttr *)(&pCVar8->op + 2))->relName;
        condition.rhsAttr.attrName = *ppcVar1;
        condition.rhsValue._0_8_ = ppcVar1[1];
        condition.rhsValue.data = pCVar3[lVar10].rhsValue.data;
        this_local._4_4_ = QL_Node::AddCondition(*topNode,condition,index);
        if (this_local._4_4_ != 0) goto LAB_00118c76;
      }
    }
  }
  this_local._4_4_ = 0;
LAB_00118c76:
  std::__cxx11::string::~string((string *)&start);
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::SetUpFirstNode(QL_Node *&topNode){
  RC rc = 0;
  bool useSelNode = false; // whether a select node was used with this relation
  bool useIndex = false; // whether an index is being used on this relation
  int relIndex = 0; // take the first element of relEntries as the 1st relation

  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries);
  topNode = relNode;

  // Create the list of attributes associated with this relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString];
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node with this list of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // count the number of conditions associated with this node:
  int numConds;
  CountNumConditions(0, numConds);

  // For each of the conditions, add it to the relation
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == 0){
      bool added = false;
      // If it is a R.A=v condition, make the relation use index scan if there isn't already
      // an index, and if this isn't a update operation
      if(condptr[i].op == EQ_OP && !condptr[i].bRhsIsAttr && useIndex == false && isUpdate == false){
        int index = 0;
        if((rc = GetAttrCatEntryPos(condptr[i].lhsAttr, index) ))
          return (rc);
        if((attrEntries[index].indexNo != -1)){ // add only if there is an index on this attribute
          if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[i].rhsValue.data) ))
            return (rc);
          added = true;
          useIndex = true;
        }
      }
      // Otherwise, create a select node and add the condition to the select node (or just add
      // if select node has already been created)
      if(! added && !useSelNode){
        QL_NodeSel *selNode = new QL_NodeSel(*this, *relNode);
        if((rc = selNode->SetUpNode(numConds) ))
          return (rc);
        topNode = selNode;
        useSelNode = true;
      }
      if(! added){
        if((rc = topNode->AddCondition(condptr[i], i) ))
          return (rc);
      }
    }
  }
  return (0);
}